

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O1

void Wlc_NtkShortNames(Wlc_Ntk_t *p)

{
  ushort uVar1;
  Wlc_Obj_t *pWVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  int fFound;
  char pBuffer [100];
  int local_9c;
  char local_98 [104];
  
  uVar4 = (p->vCos).nSize - (p->vPos).nSize;
  if (1 < uVar4) {
    uVar12 = 0;
    uVar7 = uVar4 - 1;
    uVar4 = uVar12;
    if (uVar7 != 0) {
      do {
        uVar4 = uVar12 + 1;
        bVar3 = 9 < uVar7;
        uVar12 = uVar4;
        uVar7 = uVar7 / 10;
      } while (bVar3);
    }
  }
  if (0 < (p->vCos).nSize) {
    lVar9 = 0;
    do {
      iVar5 = (p->vCos).pArray[lVar9];
      lVar8 = (long)iVar5;
      if ((lVar8 < 1) || (p->nObjsAlloc <= iVar5)) goto LAB_0036f83b;
      pWVar2 = p->pObjs;
      if ((pWVar2[lVar8].field_0x1 & 2) == 0) {
        sprintf(local_98,"%s%0*d","fi",(ulong)uVar4,(ulong)(uint)((int)lVar9 - (p->vPos).nSize));
        iVar5 = Abc_NamStrFindOrAdd(p->pManName,local_98,&local_9c);
        uVar12 = (int)((long)pWVar2 + (lVar8 * 0x18 - (long)p->pObjs) >> 3) * -0x55555555;
        if (((int)uVar12 < 0) || ((p->vNameIds).nSize <= (int)uVar12)) goto LAB_0036f85a;
        (p->vNameIds).pArray[uVar12 & 0x7fffffff] = iVar5;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < (p->vCos).nSize);
  }
  if (0 < (p->vCis).nSize) {
    lVar9 = 0;
    do {
      iVar5 = (p->vCis).pArray[lVar9];
      lVar8 = (long)iVar5;
      if ((lVar8 < 1) || (p->nObjsAlloc <= iVar5)) goto LAB_0036f83b;
      pWVar2 = p->pObjs;
      if ((undefined1  [24])((undefined1  [24])pWVar2[lVar8] & (undefined1  [24])0x3f) !=
          (undefined1  [24])0x1) {
        sprintf(local_98,"%s%0*d","fo",(ulong)uVar4,(ulong)(uint)((int)lVar9 - (p->vPis).nSize));
        iVar5 = Abc_NamStrFindOrAdd(p->pManName,local_98,&local_9c);
        uVar12 = (int)((long)pWVar2 + (lVar8 * 0x18 - (long)p->pObjs) >> 3) * -0x55555555;
        if (((int)uVar12 < 0) || ((p->vNameIds).nSize <= (int)uVar12)) goto LAB_0036f85a;
        (p->vNameIds).pArray[uVar12 & 0x7fffffff] = iVar5;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < (p->vCis).nSize);
  }
  uVar4 = (p->vPos).nSize;
  if (1 < uVar4) {
    uVar12 = 0;
    uVar7 = uVar4 - 1;
    uVar4 = uVar12;
    if (uVar7 != 0) {
      do {
        uVar4 = uVar12 + 1;
        bVar3 = 9 < uVar7;
        uVar12 = uVar4;
        uVar7 = uVar7 / 10;
      } while (bVar3);
    }
  }
  if (0 < (p->vPos).nSize) {
    uVar10 = 0;
    do {
      iVar5 = (p->vPos).pArray[uVar10];
      if (((long)iVar5 < 1) || (p->nObjsAlloc <= iVar5)) goto LAB_0036f83b;
      pWVar2 = p->pObjs;
      sprintf(local_98,"%s%0*d","po",(ulong)uVar4,uVar10 & 0xffffffff);
      iVar6 = Abc_NamStrFindOrAdd(p->pManName,local_98,&local_9c);
      uVar12 = (int)((long)pWVar2 + ((long)iVar5 * 0x18 - (long)p->pObjs) >> 3) * -0x55555555;
      if (((int)uVar12 < 0) || ((p->vNameIds).nSize <= (int)uVar12)) goto LAB_0036f85a;
      (p->vNameIds).pArray[uVar12 & 0x7fffffff] = iVar6;
      uVar10 = uVar10 + 1;
    } while ((long)uVar10 < (long)(p->vPos).nSize);
  }
  uVar4 = (p->vPis).nSize;
  if (1 < uVar4) {
    uVar12 = 0;
    uVar7 = uVar4 - 1;
    uVar4 = uVar12;
    if (uVar7 != 0) {
      do {
        uVar4 = uVar12 + 1;
        bVar3 = 9 < uVar7;
        uVar12 = uVar4;
        uVar7 = uVar7 / 10;
      } while (bVar3);
    }
  }
  if (0 < (p->vPis).nSize) {
    uVar10 = 0;
    do {
      iVar5 = (p->vPis).pArray[uVar10];
      if (((long)iVar5 < 1) || (p->nObjsAlloc <= iVar5)) goto LAB_0036f83b;
      pWVar2 = p->pObjs;
      sprintf(local_98,"%s%0*d","pi",(ulong)uVar4,uVar10 & 0xffffffff);
      iVar6 = Abc_NamStrFindOrAdd(p->pManName,local_98,&local_9c);
      uVar12 = (int)((long)pWVar2 + ((long)iVar5 * 0x18 - (long)p->pObjs) >> 3) * -0x55555555;
      if (((int)uVar12 < 0) || ((p->vNameIds).nSize <= (int)uVar12)) goto LAB_0036f85a;
      (p->vNameIds).pArray[uVar12 & 0x7fffffff] = iVar6;
      uVar10 = uVar10 + 1;
    } while ((long)uVar10 < (long)(p->vPis).nSize);
  }
  uVar4 = p->iObj - 1;
  uVar10 = (ulong)uVar4;
  if (1 < uVar4) {
    uVar10 = 0;
    uVar4 = p->iObj - 2;
    if (uVar4 != 0) {
      do {
        uVar10 = (ulong)((int)uVar10 + 1);
        bVar3 = 9 < uVar4;
        uVar4 = uVar4 / 10;
      } while (bVar3);
    }
  }
  if (1 < p->iObj) {
    uVar11 = 1;
    lVar9 = 0x18;
    do {
      if ((long)p->nObjsAlloc <= (long)uVar11) {
LAB_0036f83b:
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      pWVar2 = p->pObjs;
      uVar1 = *(ushort *)(&pWVar2->field_0x0 + lVar9);
      if ((uVar1 & 0x600) == 0 && (uVar1 & 0x3d) != 1) {
        sprintf(local_98,"%s%0*d","n",uVar10,uVar11 & 0xffffffff);
        iVar5 = Abc_NamStrFindOrAdd(p->pManName,local_98,&local_9c);
        uVar4 = (int)((long)pWVar2 + (lVar9 - (long)p->pObjs) >> 3) * -0x55555555;
        if (((int)uVar4 < 0) || ((p->vNameIds).nSize <= (int)uVar4)) {
LAB_0036f85a:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        (p->vNameIds).pArray[uVar4 & 0x7fffffff] = iVar5;
      }
      uVar11 = uVar11 + 1;
      lVar9 = lVar9 + 0x18;
    } while ((long)uVar11 < (long)p->iObj);
  }
  return;
}

Assistant:

void Wlc_NtkShortNames( Wlc_Ntk_t * p )
{
    Wlc_Obj_t * pObj;
    char pBuffer[100];
    int nDigits, NameId, fFound, i;
    int nFlops = Wlc_NtkCoNum(p) - Wlc_NtkPoNum(p);
    nDigits = Abc_Base10Log( nFlops );
    Wlc_NtkForEachCo( p, pObj, i )
    {
        if ( Wlc_ObjIsPo(pObj) )
            continue;
        sprintf( pBuffer, "%s%0*d", "fi", nDigits, i - Wlc_NtkPoNum(p) );
        NameId = Abc_NamStrFindOrAdd( p->pManName, pBuffer, &fFound );
        Wlc_ObjSetNameId( p, Wlc_ObjId(p, pObj), NameId );
    }
    Wlc_NtkForEachCi( p, pObj, i )
    {
        if ( Wlc_ObjIsPi(pObj) )
            continue;
        sprintf( pBuffer, "%s%0*d", "fo", nDigits, i - Wlc_NtkPiNum(p) );
        NameId = Abc_NamStrFindOrAdd( p->pManName, pBuffer, &fFound );
        Wlc_ObjSetNameId( p, Wlc_ObjId(p, pObj), NameId );
    }
    nDigits = Abc_Base10Log( Wlc_NtkPoNum(p) );
    Wlc_NtkForEachPo( p, pObj, i )
    {
        sprintf( pBuffer, "%s%0*d", "po", nDigits, i );
        NameId = Abc_NamStrFindOrAdd( p->pManName, pBuffer, &fFound );
        Wlc_ObjSetNameId( p, Wlc_ObjId(p, pObj), NameId );
    }
    nDigits = Abc_Base10Log( Wlc_NtkPiNum(p) );
    Wlc_NtkForEachPi( p, pObj, i )
    {
        sprintf( pBuffer, "%s%0*d", "pi", nDigits, i );
        NameId = Abc_NamStrFindOrAdd( p->pManName, pBuffer, &fFound );
        Wlc_ObjSetNameId( p, Wlc_ObjId(p, pObj), NameId );
    }
    nDigits = Abc_Base10Log( Wlc_NtkObjNum(p) );
    Wlc_NtkForEachObj( p, pObj, i )
    {
        if ( Wlc_ObjIsCi(pObj) || Wlc_ObjIsCo(pObj) )
            continue;
        sprintf( pBuffer, "%s%0*d", "n", nDigits, i );
        NameId = Abc_NamStrFindOrAdd( p->pManName, pBuffer, &fFound );
        Wlc_ObjSetNameId( p, Wlc_ObjId(p, pObj), NameId );
    }
}